

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

param_configuration *
nonius::detail::parser<nonius::param_configuration>::parse
          (param_configuration *__return_storage_ptr__,string *param)

{
  pointer pcVar1;
  const_iterator cVar2;
  long lVar3;
  element_type *unaff_RBP;
  long *unaff_R13;
  undefined1 auVar4 [12];
  mapped_type def;
  value_type name;
  param step;
  param init;
  value_type oper;
  size_t count;
  stringstream ss;
  param *local_2e8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  undefined1 local_2c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  param local_290;
  param local_280;
  long *local_270;
  long local_268;
  long local_260 [2];
  size_t local_250;
  undefined1 local_248 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Alloc_hider local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  element_type *local_208;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_200;
  element_type *local_1f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f0;
  size_t local_1e8;
  is_any_ofF local_1d8;
  long *local_1b8 [2];
  long local_1a8;
  undefined4 uStack_19c;
  element_type *local_198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_190;
  undefined1 local_188 [80];
  ios_base local_138 [264];
  
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  is_any_of(&local_1d8,":");
  split<nonius::detail::is_any_ofF>(&local_2d8,param,&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.chars._M_dataplus._M_p != &local_1d8.chars.field_2) {
    operator_delete(local_1d8.chars._M_dataplus._M_p,
                    local_1d8.chars.field_2._M_allocated_capacity + 1);
  }
  if (local_2d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_2d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pcVar1 = ((local_2d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    local_2b0._M_allocated_capacity = (size_type)&local_2a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_2c0 + 0x10),pcVar1,
               pcVar1 + (local_2d8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    if (global_param_registry()::instance == '\0') {
      parse();
    }
    cVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)global_param_registry()::instance,(key_type *)(local_2c0 + 0x10));
    if (cVar2.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_true>
        ._M_cur != (__node_type *)0x0) {
      local_2c0._0_8_ =
           *(undefined8 *)
            ((long)cVar2.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_true>
                   ._M_cur + 0x28);
      local_2c0._8_8_ =
           *(undefined8 *)
            ((long)cVar2.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_true>
                   ._M_cur + 0x30);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c0._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c0._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c0._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c0._8_8_)->_M_use_count + 1;
        }
      }
      lVar3 = (long)local_2d8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_2d8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      if (lVar3 == 5) {
        pcVar1 = local_2d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
        local_270 = local_260;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_270,pcVar1,
                   pcVar1 + local_2d8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
        nonius::param::parse(&local_280,(string *)local_2c0);
        nonius::param::parse(&local_290,(string *)local_2c0);
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)local_1b8,
                   (string *)
                   (local_2d8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 4),_S_out|_S_in);
        local_250 = 0;
        std::istream::_M_extract<unsigned_long>((ulong *)local_1b8);
        lVar3 = local_1b8[0][-3];
        *(undefined4 *)((long)&uStack_19c + lVar3) = 4;
        std::ios::clear((int)local_2e8 + (int)lVar3 + 0x130);
        (__return_storage_ptr__->map).
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
        ._M_h._M_buckets = (__buckets_ptr)0x0;
        (__return_storage_ptr__->map).
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
        ._M_h._M_bucket_count = 0;
        *(undefined8 *)
         &(__return_storage_ptr__->map).
          super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
          ._M_h._M_rehash_policy = 0;
        (__return_storage_ptr__->map).
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
        ._M_h._M_rehash_policy._M_next_resize = 0;
        (__return_storage_ptr__->map).
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
        ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        (__return_storage_ptr__->map).
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
        ._M_h._M_element_count = 0;
        (__return_storage_ptr__->map).
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
        ._M_h._M_single_bucket = (__node_base_ptr)0x0;
        (__return_storage_ptr__->map).
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
        ._M_h._M_buckets =
             &(__return_storage_ptr__->map).
              super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
              ._M_h._M_single_bucket;
        (__return_storage_ptr__->map).
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
        ._M_h._M_bucket_count = 1;
        (__return_storage_ptr__->map).
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
        ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        (__return_storage_ptr__->map).
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
        ._M_h._M_rehash_policy._M_next_resize = 0;
        (__return_storage_ptr__->map).
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
        ._M_h._M_single_bucket = (__node_base_ptr)0x0;
        local_248._0_8_ = (element_type *)(local_248 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_248,local_2b0._M_allocated_capacity,
                   local_2b0._8_8_ + local_2b0._M_allocated_capacity);
        local_228._M_p = (pointer)&local_218;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_228,local_270,local_268 + (long)local_270);
        local_208 = local_280.impl_.
                    super___shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_200._M_pi =
             local_280.impl_.
             super___shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
        if (local_280.impl_.super___shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_280.impl_.
             super___shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_280.impl_.
                  super___shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_280.impl_.
             super___shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_280.impl_.
                  super___shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_1f8 = local_290.impl_.
                    super___shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_1f0._M_pi =
             local_290.impl_.
             super___shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
        if (local_290.impl_.super___shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_290.impl_.
             super___shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_290.impl_.
                  super___shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_290.impl_.
             super___shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_290.impl_.
                  super___shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_1e8 = local_250;
        (__return_storage_ptr__->run).initialized = false;
        optional<nonius::run_configuration>::construct
                  (&__return_storage_ptr__->run,(run_configuration *)local_248);
        if (local_1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f0._M_pi);
        }
        if (local_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_p != &local_218) {
          operator_delete(local_228._M_p,local_218._M_allocated_capacity + 1);
        }
        if ((element_type *)local_248._0_8_ != (element_type *)(local_248 + 0x10)) {
          operator_delete((void *)local_248._0_8_,local_238._M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_138);
        if (local_290.impl_.super___shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_290.impl_.
                     super___shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_280.impl_.super___shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_280.impl_.
                     super___shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_270 != local_260) {
          operator_delete(local_270,local_260[0] + 1);
        }
      }
      else {
        if (lVar3 != 2) {
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c0._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c0._8_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_allocated_capacity != &local_2a0) {
            operator_delete((void *)local_2b0._M_allocated_capacity,
                            local_2a0._M_allocated_capacity + 1);
          }
          goto LAB_00150195;
        }
        nonius::param::parse((param *)local_248,(string *)local_2c0);
        local_1b8[0] = &local_1a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1b8,local_2b0._M_allocated_capacity,
                   local_2b0._8_8_ + local_2b0._M_allocated_capacity);
        local_198 = (element_type *)local_248._0_8_;
        p_Stack_190 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_;
        local_248._0_8_ = (element_type *)0x0;
        local_248._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_2e8[0] = &local_290;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,nonius::param>,std::allocator<std::pair<std::__cxx11::string_const,nonius::param>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_Hashtable<std::pair<std::__cxx11::string_const,nonius::param>const*>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,nonius::param>,std::allocator<std::pair<std::__cxx11::string_const,nonius::param>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)__return_storage_ptr__,local_1b8,local_188,0,&local_270,&local_280);
        (__return_storage_ptr__->run).initialized = false;
        if (p_Stack_190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_190);
        }
        if (local_1b8[0] != &local_1a8) {
          operator_delete(local_1b8[0],local_1a8 + 1);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_);
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c0._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_allocated_capacity != &local_2a0) {
        operator_delete((void *)local_2b0._M_allocated_capacity,local_2a0._M_allocated_capacity + 1)
        ;
      }
      goto LAB_00150309;
    }
    auVar4 = std::__throw_out_of_range("_Map_base::at");
    if ((element_type *)local_248._0_8_ != unaff_RBP) {
      operator_delete((void *)local_248._0_8_,local_238._M_allocated_capacity + 1);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)__return_storage_ptr__);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    if (local_290.impl_.super___shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_290.impl_.
                 super___shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_280.impl_.super___shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_280.impl_.
                 super___shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_270 != unaff_R13) {
      operator_delete(local_270,local_260[0] + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c0._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_allocated_capacity != &local_2a0) {
      operator_delete((void *)local_2b0._M_allocated_capacity,local_2a0._M_allocated_capacity + 1);
    }
    if (auVar4._8_4_ != 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2d8);
      _Unwind_Resume(auVar4._0_8_);
    }
    __cxa_begin_catch(auVar4._0_8_);
    __cxa_end_catch();
  }
LAB_00150195:
  (__return_storage_ptr__->map).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
  ._M_h._M_buckets = (__buckets_ptr)0x0;
  (__return_storage_ptr__->map).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
  ._M_h._M_bucket_count = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->map).
    super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
    ._M_h._M_rehash_policy = 0;
  (__return_storage_ptr__->map).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->map).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->map).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
  ._M_h._M_element_count = 0;
  (__return_storage_ptr__->map).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__return_storage_ptr__->map).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
  ._M_h._M_buckets =
       &(__return_storage_ptr__->map).
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
        ._M_h._M_single_bucket;
  (__return_storage_ptr__->map).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
  ._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->map).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->map).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->map).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__return_storage_ptr__->run).initialized = false;
LAB_00150309:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d8);
  return __return_storage_ptr__;
}

Assistant:

static param_configuration parse(std::string const& param) {
                auto v = std::vector<std::string>{};
                split(v, param, is_any_of(":"));
                try {
                    if (v.size() > 0) {
                        auto name = v[0];
                        auto def  = global_param_registry().defaults().at(name);
                        if (v.size() == 2)
                            return {{{name, def.parse(v[1])}}, {}};
                        else if (v.size() == 5) {
                            auto oper  = v[1];
                            auto init  = def.parse(v[2]);
                            auto step  = def.parse(v[3]);
                            std::stringstream ss(v[4]);
                            auto count = size_t();
                            ss >> count;
                            ss.exceptions(std::ios::failbit);
                            return {{}, run_configuration{name, oper, init, step, count}};
                        }
                    }
                }
                catch (std::out_of_range const&) {}
                return {};
            }